

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorTiledBoxInstancer::~DecoratorTiledBoxInstancer(DecoratorTiledBoxInstancer *this)

{
  DecoratorTiledBoxInstancer *this_local;
  
  ~DecoratorTiledBoxInstancer(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

DecoratorTiledBoxInstancer::~DecoratorTiledBoxInstancer() {}